

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

void __thiscall Centaurus::ATNNode<char>::ATNNode(ATNNode<char> *this)

{
  ATNNode<char> *this_local;
  
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_002c0f48;
  std::vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>::
  vector(&this->m_transitions);
  this->m_type = Blank;
  Identifier::Identifier(&this->m_invoke);
  NFA<char>::NFA(&this->m_nfa);
  std::__cxx11::string::string((string *)&this->m_literal);
  this->m_localid = -1;
  return;
}

Assistant:

ATNNode()
        : m_type(ATNNodeType::Blank), m_localid(-1)
    {
    }